

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult *
iutest::internal::CmpHelperNearFloatingPoint<double>
          (AssertionResult *__return_storage_ptr__,char *expr1,char *expr2,char *absc,double val1,
          double val2,double abs_v)

{
  bool bVar1;
  AssertionResult *pAVar2;
  FInt local_c8;
  string local_b0;
  AssertionResult local_80;
  floating_point<double> local_58;
  floating_point<double> f2;
  floating_point<double> f1;
  double diff;
  double abs_v_local;
  double val2_local;
  double val1_local;
  char *absc_local;
  char *expr2_local;
  char *expr1_local;
  
  if (val1 <= val2) {
    local_c8.fv = val2 - val1;
  }
  else {
    local_c8.fv = val1 - val2;
  }
  f1.m_v = local_c8;
  diff = abs_v;
  abs_v_local = val2;
  val2_local = val1;
  val1_local = (double)absc;
  absc_local = expr2;
  expr2_local = expr1;
  expr1_local = (char *)__return_storage_ptr__;
  if (local_c8.fv < abs_v) {
    AssertionSuccess();
  }
  else {
    floating_point<double>::floating_point(&f2,local_c8.fv);
    floating_point<double>::floating_point(&local_58,diff);
    bVar1 = floating_point<double>::AlmostEquals(&f2,&local_58);
    if (bVar1) {
      AssertionSuccess();
    }
    else {
      AssertionFailure();
      pAVar2 = AssertionResult::operator<<(&local_80,(char (*) [22])"error: Value of: abs(");
      pAVar2 = AssertionResult::operator<<(pAVar2,&expr2_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
      pAVar2 = AssertionResult::operator<<(pAVar2,&absc_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [6])") <= ");
      pAVar2 = AssertionResult::operator<<(pAVar2,(char **)&val1_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [16])"\n  Actual: abs(");
      pAVar2 = AssertionResult::operator<<(pAVar2,&val2_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [4])" - ");
      pAVar2 = AssertionResult::operator<<(pAVar2,&abs_v_local);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [5])") : ");
      pAVar2 = AssertionResult::operator<<(pAVar2,(double *)&f1);
      pAVar2 = AssertionResult::operator<<(pAVar2,(char (*) [12])"\nExpected: ");
      FormatForComparisonFailureMessage<double,double>
                (&local_b0,(internal *)&diff,(double *)&f1,(double *)absc);
      pAVar2 = AssertionResult::operator<<(pAVar2,&local_b0);
      AssertionResult::AssertionResult(__return_storage_ptr__,pAVar2);
      std::__cxx11::string::~string((string *)&local_b0);
      AssertionResult::~AssertionResult(&local_80);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ CmpHelperNearFloatingPoint(
    const char* expr1, const char* expr2, const char* absc
        , RawType val1, RawType val2, RawType abs_v)
{
    const RawType diff = val1 > val2 ? val1 - val2 : val2 - val1;
    if IUTEST_COND_LIKELY( diff < abs_v )
    {
        return AssertionSuccess();
    }